

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

WeightParams * __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::_internal_mutable_recursionmatrix
          (SimpleRecurrentLayerParams *this)

{
  ulong uVar1;
  WeightParams *pWVar2;
  Arena *arena;
  
  if (this->recursionmatrix_ != (WeightParams *)0x0) {
    return this->recursionmatrix_;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    arena = *(Arena **)arena;
  }
  pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>(arena);
  this->recursionmatrix_ = pWVar2;
  return pWVar2;
}

Assistant:

inline ::CoreML::Specification::WeightParams* SimpleRecurrentLayerParams::_internal_mutable_recursionmatrix() {
  
  if (recursionmatrix_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::WeightParams>(GetArenaForAllocation());
    recursionmatrix_ = p;
  }
  return recursionmatrix_;
}